

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * create_swizzle_abi_cxx11_(string *__return_storage_ptr__,MSLComponentSwizzle swizzle)

{
  CompilerError *this;
  char *pcVar1;
  allocator local_39;
  string local_38;
  
  switch(swizzle) {
  case MSL_COMPONENT_SWIZZLE_IDENTITY:
    pcVar1 = "spvSwizzle::none";
    break;
  case MSL_COMPONENT_SWIZZLE_ZERO:
    pcVar1 = "spvSwizzle::zero";
    break;
  case MSL_COMPONENT_SWIZZLE_ONE:
    pcVar1 = "spvSwizzle::one";
    break;
  case MSL_COMPONENT_SWIZZLE_R:
    pcVar1 = "spvSwizzle::red";
    break;
  case MSL_COMPONENT_SWIZZLE_G:
    pcVar1 = "spvSwizzle::green";
    break;
  case MSL_COMPONENT_SWIZZLE_B:
    pcVar1 = "spvSwizzle::blue";
    break;
  case MSL_COMPONENT_SWIZZLE_A:
    pcVar1 = "spvSwizzle::alpha";
    break;
  default:
    this = (CompilerError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_38,"Invalid component swizzle.",&local_39);
    spirv_cross::CompilerError::CompilerError(this,&local_38);
    __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static string create_swizzle(MSLComponentSwizzle swizzle)
{
	switch (swizzle)
	{
	case MSL_COMPONENT_SWIZZLE_IDENTITY:
		return "spvSwizzle::none";
	case MSL_COMPONENT_SWIZZLE_ZERO:
		return "spvSwizzle::zero";
	case MSL_COMPONENT_SWIZZLE_ONE:
		return "spvSwizzle::one";
	case MSL_COMPONENT_SWIZZLE_R:
		return "spvSwizzle::red";
	case MSL_COMPONENT_SWIZZLE_G:
		return "spvSwizzle::green";
	case MSL_COMPONENT_SWIZZLE_B:
		return "spvSwizzle::blue";
	case MSL_COMPONENT_SWIZZLE_A:
		return "spvSwizzle::alpha";
	default:
		SPIRV_CROSS_THROW("Invalid component swizzle.");
	}
}